

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall Minisat::DoubleOption::printOptionCall(DoubleOption *this,stringstream *s)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  poVar2 = (ostream *)(s + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-",1);
  __s = (this->super_Option).name;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
  std::ostream::_M_insert<double>(this->value);
  return;
}

Assistant:

virtual void printOptionCall(std::stringstream &s) { s << "-" << name << "=" << value; }